

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O0

void __thiscall
wasm::TypeUpdater::makeBlockUnreachableIfNoFallThrough(TypeUpdater *this,Block *curr)

{
  Block *curr_00;
  bool bVar1;
  Expression **ppEVar2;
  ExpressionList *this_00;
  Type local_60;
  BasicType local_54;
  Expression *local_50;
  Expression *child;
  Iterator __end2;
  Iterator __begin2;
  ExpressionList *__range2;
  Block *local_18;
  Block *curr_local;
  TypeUpdater *this_local;
  
  __range2._4_4_ = 1;
  local_18 = curr;
  curr_local = (Block *)this;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                      type,(BasicType *)((long)&__range2 + 4));
  if (!bVar1) {
    bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::empty
                      (&(local_18->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    if (!bVar1) {
      ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          (&(local_18->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
      bVar1 = wasm::Type::isConcrete(&(*ppEVar2)->type);
      if (bVar1) {
        return;
      }
    }
    this_00 = &local_18->list;
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&this_00->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _child = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                       (&this_00->
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    while (bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end2.index,(Iterator *)&child), bVar1) {
      ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&__end2.index);
      local_50 = *ppEVar2;
      local_54 = unreachable;
      bVar1 = wasm::Type::operator==(&local_50->type,&local_54);
      curr_00 = local_18;
      if (bVar1) {
        wasm::Type::Type(&local_60,unreachable);
        changeTypeTo(this,(Expression *)curr_00,local_60);
        return;
      }
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end2.index);
    }
  }
  return;
}

Assistant:

void makeBlockUnreachableIfNoFallThrough(Block* curr) {
    if (curr->type == Type::unreachable) {
      return; // no change possible
    }
    if (!curr->list.empty() && curr->list.back()->type.isConcrete()) {
      // should keep type due to fallthrough, even if has an unreachable child
      return;
    }
    for (auto* child : curr->list) {
      if (child->type == Type::unreachable) {
        // no fallthrough, and an unreachable, => this block is now unreachable
        changeTypeTo(curr, Type::unreachable);
        return;
      }
    }
  }